

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O0

bool dxil_spv::emit_create_handle
               (Impl *impl,CallInst *instruction,ResourceType resource_type,uint resource_range,
               Value *instruction_offset,bool non_uniform)

{
  mapped_type mVar1;
  undefined8 uVar2;
  bool bVar3;
  Op OVar4;
  Dim DVar5;
  Id IVar6;
  uint uVar7;
  Vector<RawDeclarationVariable> *pVVar8;
  reference pvVar9;
  size_type sVar10;
  ResourceReference *counter;
  mapped_type *pmVar11;
  size_type sVar12;
  vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
  *this;
  reference pRVar13;
  LoggingCallback p_Var14;
  void *pvVar15;
  mapped_type *this_00;
  mapped_type *pmVar16;
  undefined1 local_8521;
  mapped_type *meta_8;
  char buffer_7 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_7;
  bool local_74a5;
  Id loaded_id_3;
  bool is_non_uniform_3;
  ResourceReference *pRStack_74a0;
  Id base_sampler_id;
  ResourceReference *reference_3;
  mapped_type *meta_7;
  mapped_type *incoming_meta_2;
  RawVecSize local_7480;
  Id local_747c;
  char local_7478 [8];
  char buffer_6 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_6;
  RawDeclarationVariable *alias_2;
  iterator __end6;
  iterator __begin6;
  Vector<RawDeclarationVariable> *__range6;
  char buffer_5 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_5;
  ResourceMetaInstrumentation instrumentation_2;
  Id resource_id_2;
  Id loaded_id_2;
  Vector<Converter::Impl::RawDeclarationVariable> raw_declarations_2;
  DescriptorQATypeFlagBits descriptor_type_2;
  StorageClass storage_2;
  bool ssbo;
  bool is_non_uniform_2;
  ResourceMeta local_53f8;
  mapped_type *local_53a8;
  mapped_type *meta_6;
  CallInst *pCStack_5398;
  Id id;
  mapped_type local_538c;
  ResourceKind local_5388;
  ComponentType local_5387;
  uint member_offset;
  uint local_5380;
  Id local_537c;
  bool local_5360;
  bool local_535f;
  bool local_535e;
  bool local_535d;
  StorageClass local_535c;
  Id local_5358;
  bool local_5354;
  bool local_5353;
  bool local_5352;
  bool local_5351;
  uint8_t local_5350;
  uint32_t local_534c;
  Id local_5348;
  Id local_5344;
  Id local_5340;
  Id local_533c;
  mapped_type *local_5338;
  mapped_type *meta_5;
  reference pvStack_5328;
  Id ptr_id_3;
  LocalRootSignatureEntry *local_root_signature_entry;
  ResourceReference *reference_2;
  char buffer_4 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_4;
  ResourceReference *counter_reference;
  Id local_42e4;
  mapped_type *pmStack_42e0;
  Id type_id_1;
  mapped_type *meta_4;
  mapped_type *pmStack_42d0;
  Id offset_buffer_id_1;
  mapped_type *incoming_meta_1;
  RawVecSize local_42c0;
  Id local_42bc;
  char local_42b8 [8];
  char buffer_3 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_3;
  RawDeclarationVariable *alias_1;
  iterator __end4;
  iterator __begin4;
  Vector<RawDeclarationVariable> *__range4;
  char buffer_2 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_2;
  undefined4 uStack_2270;
  ResourceMetaInstrumentation instrumentation_1;
  Id resource_ptr_id;
  Id resource_id_1;
  Id offset_id_1;
  Id loaded_id_1;
  Vector<Converter::Impl::RawDeclarationVariable> raw_declarations_1;
  DescriptorQATypeFlagBits descriptor_type_1;
  StorageClass storage_1;
  Id representative_var_id_1;
  RawVecSize RStack_222c;
  bool is_non_uniform_1;
  uint local_2228;
  Id local_2224;
  vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
  vStack_2220;
  bool local_2208;
  bool local_2207;
  bool local_2206;
  bool local_2205;
  StorageClass local_2204;
  Id local_2200;
  bool local_21fc;
  bool local_21fb;
  bool local_21fa;
  bool local_21f9;
  uint8_t local_21f8;
  uint32_t local_21f4;
  Id local_21f0;
  Id local_21ec;
  Id local_21e8;
  Id local_21e4;
  mapped_type *local_21e0;
  mapped_type *meta_3;
  ResourceReference *pRStack_21d0;
  Id ptr_id_2;
  ResourceReference *reference_1;
  Id dummy_value;
  Id type_id;
  mapped_type *meta_2;
  mapped_type *pmStack_21b0;
  Id offset_buffer_id;
  mapped_type *incoming_meta;
  RawVecSize local_21a0;
  Id local_219c;
  char local_2198 [8];
  char buffer_1 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_1;
  RawDeclarationVariable *alias;
  iterator __end5;
  iterator __begin5;
  Vector<RawDeclarationVariable> *__range5;
  char local_1168 [8];
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  ResourceMetaInstrumentation instrumentation;
  Id resource_id;
  Id offset_id;
  Id loaded_id;
  Vector<Converter::Impl::RawDeclarationVariable> raw_declarations;
  DescriptorQATypeFlagBits descriptor_type;
  StorageClass storage;
  Id representative_var_id;
  RawVecSize RStack_11c;
  bool is_non_uniform;
  uint local_118;
  Id local_114;
  vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
  vStack_110;
  bool local_f8;
  bool local_f7;
  bool local_f6;
  bool local_f5;
  StorageClass local_f4;
  Id local_f0;
  bool local_ec;
  bool local_eb;
  bool local_ea;
  bool local_e9;
  uint8_t local_e8;
  uint32_t local_e4;
  Id local_e0;
  Id local_dc;
  Id local_d8;
  Id local_d4;
  mapped_type *local_d0;
  mapped_type *meta_1;
  ResourceKind local_c0;
  ComponentType local_bf;
  Id ptr_id_1;
  uint local_b8;
  Id local_b4;
  bool local_98;
  bool local_97;
  bool local_96;
  bool local_95;
  StorageClass local_94;
  Id local_90;
  bool local_8c;
  bool local_8b;
  bool local_8a;
  bool local_89;
  uint8_t local_88;
  uint32_t local_84;
  Id local_80;
  Id local_7c;
  Id local_78;
  Id local_74;
  mapped_type *local_70;
  mapped_type *meta;
  ResourceReference *pRStack_60;
  Id ptr_id;
  ResourceReference *reference;
  Builder *builder;
  Value *pVStack_48;
  bool non_uniform_local;
  Value *instruction_offset_local;
  uint resource_range_local;
  ResourceType resource_type_local;
  CallInst *instruction_local;
  Impl *impl_local;
  
  builder._7_1_ = non_uniform;
  pVStack_48 = instruction_offset;
  instruction_offset_local._0_4_ = resource_range;
  instruction_offset_local._7_1_ = resource_type;
  _resource_range_local = instruction;
  instruction_local = (CallInst *)impl;
  reference = (ResourceReference *)Converter::Impl::builder(impl);
  switch(instruction_offset_local._7_1_) {
  case SRV:
    pRStack_60 = get_resource_reference
                           ((Impl *)instruction_local,instruction_offset_local._7_1_,
                            _resource_range_local,(ValueKind)instruction_offset_local);
    bVar3 = resource_is_physical_rtas((Impl *)instruction_local,pRStack_60);
    if (bVar3) {
      meta._4_4_ = build_load_physical_rtas
                             ((Impl *)instruction_local,pRStack_60,pVStack_48,
                              (bool)(builder._7_1_ & 1));
      Converter::Impl::rewrite_value
                ((Impl *)instruction_local,(Value *)_resource_range_local,meta._4_4_);
      local_70 = std::
                 unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                 ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                               *)&instruction_local[0xf].super_Instruction.attachments._M_h.
                                  _M_rehash_policy._M_next_resize,(key_type *)((long)&meta + 4));
      local_c0 = Invalid;
      local_bf = Invalid;
      ptr_id_1 = 0;
      local_b8 = 0;
      local_b4 = 0;
      memset((vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
              *)&stack0xffffffffffffff50,0,0x18);
      std::
      vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ::vector((vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                *)&stack0xffffffffffffff50);
      local_98 = false;
      local_97 = false;
      local_96 = false;
      local_95 = false;
      local_94 = StorageClassUniformConstant;
      local_90 = 0;
      local_8c = false;
      local_8b = false;
      local_8a = false;
      local_89 = false;
      local_88 = '\0';
      local_84 = 0;
      local_80 = 0;
      local_7c = 0;
      local_78 = 0;
      local_74 = 0;
      Converter::Impl::ResourceMeta::operator=(local_70,(ResourceMeta *)&stack0xffffffffffffff40);
      Converter::Impl::ResourceMeta::~ResourceMeta((ResourceMeta *)&stack0xffffffffffffff40);
      local_70->storage = StorageClassGeneric;
      local_70->kind = RTAccelerationStructure;
    }
    else {
      bVar3 = resource_is_physical_pointer((Impl *)instruction_local,pRStack_60);
      if (bVar3) {
        meta_1._4_4_ = build_root_descriptor_load_physical_pointer
                                 ((Impl *)instruction_local,pRStack_60);
        Converter::Impl::rewrite_value
                  ((Impl *)instruction_local,(Value *)_resource_range_local,meta_1._4_4_);
        local_d0 = std::
                   unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                   ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                                 *)&instruction_local[0xf].super_Instruction.attachments._M_h.
                                    _M_rehash_policy._M_next_resize,(key_type *)((long)&meta_1 + 4))
        ;
        representative_var_id._0_1_ = 0;
        representative_var_id._1_1_ = 0;
        RStack_11c = V1;
        local_118 = 0;
        local_114 = 0;
        memset(&vStack_110,0,0x18);
        std::
        vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ::vector(&vStack_110);
        local_f8 = false;
        local_f7 = false;
        local_f6 = false;
        local_f5 = false;
        local_f4 = StorageClassUniformConstant;
        local_f0 = 0;
        local_ec = false;
        local_eb = false;
        local_ea = false;
        local_e9 = false;
        local_e8 = '\0';
        local_e4 = 0;
        local_e0 = 0;
        local_dc = 0;
        local_d8 = 0;
        local_d4 = 0;
        Converter::Impl::ResourceMeta::operator=(local_d0,(ResourceMeta *)&representative_var_id);
        Converter::Impl::ResourceMeta::~ResourceMeta((ResourceMeta *)&representative_var_id);
        local_d0->stride = pRStack_60->stride;
        local_d0->storage = StorageClassPhysicalStorageBuffer;
        (local_d0->physical_pointer_meta).nonwritable = true;
        local_d0->kind = pRStack_60->resource_kind;
      }
      else {
        storage._3_1_ = StorageClassUniformConstant >> 0x18;
        descriptor_type = pRStack_60->var_id;
        if ((descriptor_type == DESCRIPTOR_QA_TYPE_NONE_BIT) &&
           (bVar3 = std::
                    vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                    ::empty(&pRStack_60->var_alias_group), !bVar3)) {
          pvVar9 = std::
                   vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                   ::front(&pRStack_60->var_alias_group);
          descriptor_type = pvVar9->var_id;
        }
        raw_declarations.
        super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             get_resource_storage_class((Impl *)instruction_local,descriptor_type);
        if (raw_declarations.
            super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == StorageClassStorageBuffer) {
          raw_declarations.
          super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
               DESCRIPTOR_QA_TYPE_STORAGE_BUFFER_BIT;
        }
        else {
          bVar3 = resource_kind_is_buffer(pRStack_60->resource_kind);
          if (bVar3) {
            raw_declarations.
            super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                 DESCRIPTOR_QA_TYPE_UNIFORM_TEXEL_BUFFER_BIT;
          }
          else if (pRStack_60->resource_kind == RTAccelerationStructure) {
            raw_declarations.
            super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                 DESCRIPTOR_QA_TYPE_RT_ACCELERATION_STRUCTURE_BIT;
          }
          else {
            raw_declarations.
            super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                 DESCRIPTOR_QA_TYPE_SAMPLED_IMAGE_BIT;
          }
        }
        std::
        vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ::vector((vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                  *)&offset_id);
        resource_id = 0;
        instrumentation.resource_size_id = 0;
        instrumentation.elem_size_id = 0;
        sVar12 = std::
                 vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                 ::size(&pRStack_60->var_alias_group);
        std::
        vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ::reserve((vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                   *)&offset_id,sVar12);
        memset(&cb,0,0xc);
        if (pRStack_60->var_id == 0) {
LAB_001fab31:
          pVVar8 = &pRStack_60->var_alias_group;
          __end5 = std::
                   vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                   ::begin(pVVar8);
          alias = (RawDeclarationVariable *)
                  std::
                  vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                  ::end(pVVar8);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<dxil_spv::Converter::Impl::RawDeclarationVariable_*,_std::vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>_>
                                             *)&alias), bVar3) {
            pRVar13 = __gnu_cxx::
                      __normal_iterator<dxil_spv::Converter::Impl::RawDeclarationVariable_*,_std::vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>_>
                      ::operator*(&__end5);
            instrumentation.elem_size_id = pRVar13->var_id;
            bVar3 = build_load_resource_handle
                              ((Impl *)instruction_local,instrumentation.elem_size_id,pRStack_60,
                               (DescriptorQATypeFlagBits)
                               raw_declarations.
                               super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               _resource_range_local,pVStack_48,(bool)(builder._7_1_ & 1),
                               (bool *)((long)&storage + 3),(Id *)0x0,&resource_id,
                               &instrumentation.resource_size_id,(ResourceMetaInstrumentation *)&cb)
            ;
            if (!bVar3) {
              buffer_1._4088_8_ = get_thread_log_callback();
              if ((LoggingCallback)buffer_1._4088_8_ == (LoggingCallback)0x0) {
                fprintf(_stderr,"[ERROR]: Failed to load SRV resource handle.\n");
                fflush(_stderr);
              }
              else {
                snprintf(local_2198,0x1000,"Failed to load SRV resource handle.\n");
                uVar2 = buffer_1._4088_8_;
                pvVar15 = get_thread_log_callback_userdata();
                (*(code *)uVar2)(pvVar15,2,local_2198);
              }
              impl_local._7_1_ = 0;
              bVar3 = true;
              goto LAB_001faeff;
            }
            incoming_meta = *(mapped_type **)&pRVar13->declaration;
            local_21a0 = (pRVar13->declaration).vecsize;
            local_219c = resource_id;
            std::
            vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
            ::push_back((vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                         *)&offset_id,(value_type *)&incoming_meta);
            __gnu_cxx::
            __normal_iterator<dxil_spv::Converter::Impl::RawDeclarationVariable_*,_std::vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>_>
            ::operator++(&__end5);
          }
          pmStack_21b0 = std::
                         unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                         ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                                       *)&instruction_local[0xf].super_Instruction.attachments._M_h.
                                          _M_rehash_policy._M_next_resize,
                                      &instrumentation.elem_size_id);
          meta_2._4_4_ = get_offset_buffer_variable
                                   ((Impl *)instruction_local,instruction_offset_local._7_1_,
                                    _resource_range_local,(ValueKind)instruction_offset_local);
          if (meta_2._4_4_ == 0) {
            instrumentation.resource_size_id = 0;
          }
          else {
            instrumentation.resource_size_id =
                 build_load_buffer_offset
                           ((Impl *)instruction_local,pRStack_60,pmStack_21b0,meta_2._4_4_,
                            instrumentation.resource_size_id,(bool)(builder._7_1_ & 1));
          }
          _dummy_value = std::
                         unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                         ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                                       *)&instruction_local[0xf].super_Instruction.attachments._M_h.
                                          _M_rehash_policy._M_next_resize,&resource_id);
          Converter::Impl::ResourceMeta::operator=(_dummy_value,pmStack_21b0);
          _dummy_value->non_uniform = (bool)(storage._3_1_ & 1);
          _dummy_value->index_offset_id = instrumentation.resource_size_id;
          std::
          vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
          ::operator=(&_dummy_value->var_alias_group,
                      (vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                       *)&offset_id);
          _dummy_value->aliased = (bool)(pRStack_60->aliased & 1);
          (_dummy_value->physical_pointer_meta).nonwritable = true;
          *(_func_void_void_ptr_LogLevel_char_ptr **)&_dummy_value->instrumentation = cb;
          (_dummy_value->instrumentation).resource_size_id = instrumentation.bda_id;
          if ((pRStack_60->bindless & 1U) != 0) {
            _dummy_value->stride = pRStack_60->stride;
          }
          if ((storage._3_1_ & 1) != StorageClassUniformConstant >> 0x18) {
            reference_1._4_4_ =
                 spv::Builder::getDerefTypeId((Builder *)reference,instrumentation.elem_size_id);
            reference_1._4_4_ =
                 spv::Builder::getContainedTypeId((Builder *)reference,reference_1._4_4_);
            OVar4 = spv::Builder::getTypeClass((Builder *)reference,reference_1._4_4_);
            if (OVar4 != OpTypeAccelerationStructureKHR) {
              if (_dummy_value->storage == StorageClassStorageBuffer) {
                spv::Builder::addCapability
                          ((Builder *)reference,CapabilityStorageBufferArrayNonUniformIndexing);
              }
              else {
                DVar5 = spv::Builder::getTypeDimensionality((Builder *)reference,reference_1._4_4_);
                if (DVar5 == DimBuffer) {
                  spv::Builder::addCapability
                            ((Builder *)reference,
                             CapabilityUniformTexelBufferArrayNonUniformIndexing);
                }
                else {
                  spv::Builder::addCapability
                            ((Builder *)reference,CapabilitySampledImageArrayNonUniformIndexing);
                }
              }
            }
            spv::Builder::addExtension((Builder *)reference,"SPV_EXT_descriptor_indexing");
          }
          bVar3 = false;
        }
        else {
          instrumentation.elem_size_id = pRStack_60->var_id;
          bVar3 = build_load_resource_handle
                            ((Impl *)instruction_local,instrumentation.elem_size_id,pRStack_60,
                             (DescriptorQATypeFlagBits)
                             raw_declarations.
                             super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             _resource_range_local,pVStack_48,(bool)(builder._7_1_ & 1),
                             (bool *)((long)&storage + 3),(Id *)0x0,&resource_id,
                             &instrumentation.resource_size_id,(ResourceMetaInstrumentation *)&cb);
          if (bVar3) goto LAB_001fab31;
          buffer._4088_8_ = get_thread_log_callback();
          if ((LoggingCallback)buffer._4088_8_ == (LoggingCallback)0x0) {
            fprintf(_stderr,"[ERROR]: Failed to load SRV resource handle.\n");
            fflush(_stderr);
          }
          else {
            snprintf(local_1168,0x1000,"Failed to load SRV resource handle.\n");
            uVar2 = buffer._4088_8_;
            pvVar15 = get_thread_log_callback_userdata();
            (*(code *)uVar2)(pvVar15,2,local_1168);
          }
          impl_local._7_1_ = 0;
          bVar3 = true;
        }
LAB_001faeff:
        std::
        vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ::~vector((vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                   *)&offset_id);
        if (bVar3) goto LAB_001fc4d6;
      }
    }
    break;
  case UAV:
    if ((ValueKind)instruction_offset_local ==
        instruction_local[6].super_Instruction.super_Value.kind) {
      if (*(int *)&instruction_local[6].super_Instruction.super_Value.field_0xc == 0) {
        reference_1._0_4_ =
             SPIRVModule::allocate_id
                       ((SPIRVModule *)(instruction_local->super_Instruction).super_Value.tween_id);
        *(uint32_t *)&instruction_local[6].super_Instruction.super_Value.field_0xc =
             (uint32_t)reference_1;
      }
      Converter::Impl::rewrite_value
                ((Impl *)instruction_local,(Value *)_resource_range_local,
                 *(Id *)&instruction_local[6].super_Instruction.super_Value.field_0xc);
    }
    else {
      pRStack_21d0 = get_resource_reference
                               ((Impl *)instruction_local,instruction_offset_local._7_1_,
                                _resource_range_local,(ValueKind)instruction_offset_local);
      bVar3 = resource_is_physical_pointer((Impl *)instruction_local,pRStack_21d0);
      if (bVar3) {
        meta_3._4_4_ = build_root_descriptor_load_physical_pointer
                                 ((Impl *)instruction_local,pRStack_21d0);
        Converter::Impl::rewrite_value
                  ((Impl *)instruction_local,(Value *)_resource_range_local,meta_3._4_4_);
        local_21e0 = std::
                     unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                     ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                                   *)&instruction_local[0xf].super_Instruction.attachments._M_h.
                                      _M_rehash_policy._M_next_resize,
                                  (key_type *)((long)&meta_3 + 4));
        representative_var_id_1._0_1_ = 0;
        representative_var_id_1._1_1_ = 0;
        RStack_222c = V1;
        local_2228 = 0;
        local_2224 = 0;
        memset(&vStack_2220,0,0x18);
        std::
        vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ::vector(&vStack_2220);
        local_2208 = false;
        local_2207 = false;
        local_2206 = false;
        local_2205 = false;
        local_2204 = StorageClassUniformConstant;
        local_2200 = 0;
        local_21fc = false;
        local_21fb = false;
        local_21fa = false;
        local_21f9 = false;
        local_21f8 = '\0';
        local_21f4 = 0;
        local_21f0 = 0;
        local_21ec = 0;
        local_21e8 = 0;
        local_21e4 = 0;
        Converter::Impl::ResourceMeta::operator=
                  (local_21e0,(ResourceMeta *)&representative_var_id_1);
        Converter::Impl::ResourceMeta::~ResourceMeta((ResourceMeta *)&representative_var_id_1);
        local_21e0->stride = pRStack_21d0->stride;
        local_21e0->storage = StorageClassPhysicalStorageBuffer;
        (local_21e0->physical_pointer_meta).coherent = (bool)(pRStack_21d0->coherent & 1);
        (local_21e0->physical_pointer_meta).rov = (bool)(pRStack_21d0->rov & 1);
        local_21e0->kind = pRStack_21d0->resource_kind;
        local_21e0->rov = (bool)(pRStack_21d0->rov & 1);
      }
      else {
        storage_1._3_1_ = StorageClassUniformConstant >> 0x18;
        descriptor_type_1 = pRStack_21d0->var_id;
        if ((descriptor_type_1 == DESCRIPTOR_QA_TYPE_NONE_BIT) &&
           (bVar3 = std::
                    vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                    ::empty(&pRStack_21d0->var_alias_group), !bVar3)) {
          pvVar9 = std::
                   vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                   ::front(&pRStack_21d0->var_alias_group);
          descriptor_type_1 = pvVar9->var_id;
        }
        raw_declarations_1.
        super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             get_resource_storage_class((Impl *)instruction_local,descriptor_type_1);
        if (raw_declarations_1.
            super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == StorageClassStorageBuffer) {
          raw_declarations_1.
          super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
               DESCRIPTOR_QA_TYPE_STORAGE_BUFFER_BIT;
        }
        else {
          bVar3 = resource_kind_is_buffer(pRStack_21d0->resource_kind);
          if (bVar3) {
            raw_declarations_1.
            super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                 DESCRIPTOR_QA_TYPE_STORAGE_TEXEL_BUFFER_BIT;
          }
          else {
            raw_declarations_1.
            super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                 DESCRIPTOR_QA_TYPE_STORAGE_IMAGE_BIT;
          }
        }
        std::
        vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ::vector((vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                  *)&offset_id_1);
        resource_id_1 = 0;
        resource_ptr_id = 0;
        instrumentation_1.resource_size_id = 0;
        instrumentation_1.elem_size_id = 0;
        sVar12 = std::
                 vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                 ::size(&pRStack_21d0->var_alias_group);
        std::
        vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ::reserve((vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                   *)&offset_id_1,sVar12);
        memset((void *)((long)&cb_2 + 4),0,0xc);
        if (pRStack_21d0->var_id == 0) {
LAB_001fb3bc:
          pVVar8 = &pRStack_21d0->var_alias_group;
          __end4 = std::
                   vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                   ::begin(pVVar8);
          alias_1 = (RawDeclarationVariable *)
                    std::
                    vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                    ::end(pVVar8);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<dxil_spv::Converter::Impl::RawDeclarationVariable_*,_std::vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>_>
                                             *)&alias_1), bVar3) {
            pRVar13 = __gnu_cxx::
                      __normal_iterator<dxil_spv::Converter::Impl::RawDeclarationVariable_*,_std::vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>_>
                      ::operator*(&__end4);
            instrumentation_1.resource_size_id = pRVar13->var_id;
            bVar3 = build_load_resource_handle
                              ((Impl *)instruction_local,instrumentation_1.resource_size_id,
                               pRStack_21d0,
                               (DescriptorQATypeFlagBits)
                               raw_declarations_1.
                               super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               _resource_range_local,pVStack_48,(bool)(builder._7_1_ & 1),
                               (bool *)((long)&storage_1 + 3),(Id *)0x0,&resource_id_1,
                               &resource_ptr_id,(ResourceMetaInstrumentation *)((long)&cb_2 + 4));
            if (!bVar3) {
              p_Var14 = get_thread_log_callback();
              if (p_Var14 == (LoggingCallback)0x0) {
                fprintf(_stderr,"[ERROR]: Failed to load UAV resource handle.\n");
                fflush(_stderr);
              }
              else {
                snprintf(local_42b8,0x1000,"Failed to load UAV resource handle.\n");
                pvVar15 = get_thread_log_callback_userdata();
                (*p_Var14)(pvVar15,Error,local_42b8);
              }
              impl_local._7_1_ = 0;
              bVar3 = true;
              goto LAB_001fb9c9;
            }
            incoming_meta_1 = *(mapped_type **)&pRVar13->declaration;
            local_42c0 = (pRVar13->declaration).vecsize;
            local_42bc = resource_id_1;
            std::
            vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
            ::push_back((vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                         *)&offset_id_1,(value_type *)&incoming_meta_1);
            __gnu_cxx::
            __normal_iterator<dxil_spv::Converter::Impl::RawDeclarationVariable_*,_std::vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>_>
            ::operator++(&__end4);
          }
          pmStack_42d0 = std::
                         unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                         ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                                       *)&instruction_local[0xf].super_Instruction.attachments._M_h.
                                          _M_rehash_policy._M_next_resize,
                                      &instrumentation_1.resource_size_id);
          meta_4._4_4_ = get_offset_buffer_variable
                                   ((Impl *)instruction_local,instruction_offset_local._7_1_,
                                    _resource_range_local,(ValueKind)instruction_offset_local);
          if (meta_4._4_4_ == 0) {
            resource_ptr_id = 0;
          }
          else {
            resource_ptr_id =
                 build_load_buffer_offset
                           ((Impl *)instruction_local,pRStack_21d0,pmStack_42d0,meta_4._4_4_,
                            resource_ptr_id,(bool)(builder._7_1_ & 1));
          }
          pmStack_42e0 = std::
                         unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                         ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                                       *)&instruction_local[0xf].super_Instruction.attachments._M_h.
                                          _M_rehash_policy._M_next_resize,&resource_id_1);
          Converter::Impl::ResourceMeta::operator=(pmStack_42e0,pmStack_42d0);
          pmStack_42e0->non_uniform = (bool)(storage_1._3_1_ & 1);
          pmStack_42e0->index_offset_id = resource_ptr_id;
          std::
          vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
          ::operator=(&pmStack_42e0->var_alias_group,
                      (vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                       *)&offset_id_1);
          pmStack_42e0->aliased = (bool)(pRStack_21d0->aliased & 1);
          pmStack_42e0->rov = (bool)(pRStack_21d0->rov & 1);
          (pmStack_42e0->physical_pointer_meta).coherent = (bool)(pRStack_21d0->coherent & 1);
          (pmStack_42e0->instrumentation).bda_id = cb_2._4_4_;
          (pmStack_42e0->instrumentation).elem_size_id = uStack_2270;
          (pmStack_42e0->instrumentation).resource_size_id = instrumentation_1.bda_id;
          pmStack_42e0->var_id = instrumentation_1.elem_size_id;
          if ((pRStack_21d0->bindless & 1U) != 0) {
            pmStack_42e0->stride = pRStack_21d0->stride;
          }
          if ((storage_1._3_1_ & 1) != StorageClassUniformConstant >> 0x18) {
            local_42e4 = spv::Builder::getDerefTypeId
                                   ((Builder *)reference,instrumentation_1.resource_size_id);
            local_42e4 = spv::Builder::getContainedTypeId((Builder *)reference,local_42e4);
            if (pmStack_42e0->storage == StorageClassStorageBuffer) {
              spv::Builder::addCapability
                        ((Builder *)reference,CapabilityStorageBufferArrayNonUniformIndexing);
            }
            else {
              DVar5 = spv::Builder::getTypeDimensionality((Builder *)reference,local_42e4);
              if (DVar5 == DimBuffer) {
                spv::Builder::addCapability
                          ((Builder *)reference,CapabilityStorageTexelBufferArrayNonUniformIndexing)
                ;
              }
              else {
                spv::Builder::addCapability
                          ((Builder *)reference,CapabilityStorageImageArrayNonUniformIndexing);
              }
            }
            spv::Builder::addExtension((Builder *)reference,"SPV_EXT_descriptor_indexing");
          }
          counter_reference = (ResourceReference *)_resource_range_local;
          sVar10 = std::
                   unordered_set<const_LLVMBC::Value_*,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Value_*>_>
                   ::count((unordered_set<const_LLVMBC::Value_*,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Value_*>_>
                            *)&instruction_local[4].super_Instruction.attachments._M_h.
                               _M_element_count,(key_type *)&counter_reference);
          if (sVar10 != 0) {
            counter = get_resource_counter_reference
                                ((Impl *)instruction_local,_resource_range_local,
                                 (ValueKind)instruction_offset_local);
            if ((counter->bindless & 1U) == 0) {
              pmStack_42e0->counter_var_id = counter->var_id;
              pmStack_42e0->counter_is_physical_pointer = false;
            }
            else if (counter->resource_kind == RawBuffer) {
              IVar6 = build_load_physical_pointer
                                ((Impl *)instruction_local,counter,pVStack_48,_resource_range_local)
              ;
              pmStack_42e0->counter_var_id = IVar6;
              pmStack_42e0->counter_is_physical_pointer = true;
              (pmStack_42e0->instrumentation).bda_id = 0;
              (pmStack_42e0->instrumentation).elem_size_id = 0;
              (pmStack_42e0->instrumentation).resource_size_id = 0;
            }
            else {
              bVar3 = build_load_resource_handle
                                ((Impl *)instruction_local,counter->var_id,pRStack_21d0,
                                 DESCRIPTOR_QA_TYPE_RAW_VA_BIT,_resource_range_local,pVStack_48,
                                 (bool)(builder._7_1_ & 1),(bool *)((long)&storage_1 + 3),
                                 &pmStack_42e0->counter_var_id,(Id *)0x0,(Id *)0x0,
                                 (ResourceMetaInstrumentation *)0x0);
              if (!bVar3) {
                p_Var14 = get_thread_log_callback();
                if (p_Var14 == (LoggingCallback)0x0) {
                  fprintf(_stderr,"[ERROR]: Failed to load UAV counter pointer.\n");
                  fflush(_stderr);
                }
                else {
                  snprintf((char *)&reference_2,0x1000,"Failed to load UAV counter pointer.\n");
                  pvVar15 = get_thread_log_callback_userdata();
                  (*p_Var14)(pvVar15,Error,(char *)&reference_2);
                }
                impl_local._7_1_ = 0;
                bVar3 = true;
                goto LAB_001fb9c9;
              }
              pmStack_42e0->counter_is_physical_pointer = false;
            }
          }
          bVar3 = false;
        }
        else {
          instrumentation_1.resource_size_id = pRStack_21d0->var_id;
          bVar3 = build_load_resource_handle
                            ((Impl *)instruction_local,instrumentation_1.resource_size_id,
                             pRStack_21d0,
                             (DescriptorQATypeFlagBits)
                             raw_declarations_1.
                             super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             _resource_range_local,pVStack_48,(bool)(builder._7_1_ & 1),
                             (bool *)((long)&storage_1 + 3),&instrumentation_1.elem_size_id,
                             &resource_id_1,&resource_ptr_id,
                             (ResourceMetaInstrumentation *)((long)&cb_2 + 4));
          if (bVar3) goto LAB_001fb3bc;
          p_Var14 = get_thread_log_callback();
          if (p_Var14 == (LoggingCallback)0x0) {
            fprintf(_stderr,"[ERROR]: Failed to load UAV resource handle.\n");
            fflush(_stderr);
          }
          else {
            snprintf((char *)&__range4,0x1000,"Failed to load UAV resource handle.\n");
            pvVar15 = get_thread_log_callback_userdata();
            (*p_Var14)(pvVar15,Error,(char *)&__range4);
          }
          impl_local._7_1_ = 0;
          bVar3 = true;
        }
LAB_001fb9c9:
        std::
        vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ::~vector((vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                   *)&offset_id_1);
        if (bVar3) goto LAB_001fc4d6;
      }
    }
    break;
  case CBV:
    local_root_signature_entry =
         (LocalRootSignatureEntry *)
         get_resource_reference
                   ((Impl *)instruction_local,instruction_offset_local._7_1_,_resource_range_local,
                    (ValueKind)instruction_offset_local);
    pvStack_5328 = (reference)0x0;
    if (-1 < ((ResourceReference *)local_root_signature_entry)->local_root_signature_entry) {
      pvStack_5328 = std::
                     vector<dxil_spv::LocalRootSignatureEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::LocalRootSignatureEntry>_>
                     ::operator[]((vector<dxil_spv::LocalRootSignatureEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::LocalRootSignatureEntry>_>
                                   *)(instruction_local + 0xd),
                                  (long)((ResourceReference *)local_root_signature_entry)->
                                        local_root_signature_entry);
    }
    bVar3 = resource_is_physical_pointer
                      ((Impl *)instruction_local,(ResourceReference *)local_root_signature_entry);
    if (bVar3) {
      meta_5._4_4_ = build_root_descriptor_load_physical_pointer
                               ((Impl *)instruction_local,
                                (ResourceReference *)local_root_signature_entry);
      local_5338 = std::
                   unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                   ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                                 *)&instruction_local[0xf].super_Instruction.attachments._M_h.
                                    _M_rehash_policy._M_next_resize,(key_type *)((long)&meta_5 + 4))
      ;
      local_5388 = Invalid;
      local_5387 = Invalid;
      member_offset = 0;
      local_5380 = 0;
      local_537c = 0;
      memset((vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
              *)&stack0xffffffffffffac88,0,0x18);
      std::
      vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ::vector((vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                *)&stack0xffffffffffffac88);
      local_5360 = false;
      local_535f = false;
      local_535e = false;
      local_535d = false;
      local_535c = StorageClassUniformConstant;
      local_5358 = 0;
      local_5354 = false;
      local_5353 = false;
      local_5352 = false;
      local_5351 = false;
      local_5350 = '\0';
      local_534c = 0;
      local_5348 = 0;
      local_5344 = 0;
      local_5340 = 0;
      local_533c = 0;
      Converter::Impl::ResourceMeta::operator=(local_5338,(ResourceMeta *)&stack0xffffffffffffac78);
      Converter::Impl::ResourceMeta::~ResourceMeta((ResourceMeta *)&stack0xffffffffffffac78);
      local_5338->stride = local_root_signature_entry[1].field_1.constants.register_space;
      local_5338->storage = StorageClassPhysicalStorageBuffer;
      (local_5338->physical_pointer_meta).nonwritable = true;
      local_5338->kind = *(ResourceKind *)((long)&local_root_signature_entry[1].field_1 + 9);
      Converter::Impl::rewrite_value
                ((Impl *)instruction_local,(Value *)_resource_range_local,meta_5._4_4_);
    }
    else if ((local_root_signature_entry->type == Constants) ||
            (local_root_signature_entry->type !=
             (LocalRootSignatureType)
             instruction_local[0xf].super_Instruction.attachments._M_h._M_bucket_count)) {
      if ((pvStack_5328 == (reference)0x0) || (pvStack_5328->type != Constants)) {
        descriptor_type_2._3_1_ = DESCRIPTOR_QA_TYPE_NONE_BIT >> 0x18;
        local_8521 = DESCRIPTOR_QA_TYPE_NONE_BIT >> 0x10;
        if ((undefined1  [12])
            ((undefined1  [12])local_root_signature_entry[1].field_1 & (undefined1  [12])0x100000000
            ) != (undefined1  [12])0x0) {
          local_8521 = *(byte *)((long)&instruction_local[0x18].super_Instruction.attachments._M_h.
                                        _M_buckets + 1);
        }
        descriptor_type_2._2_1_ = local_8521 & 1;
        uVar7 = 2;
        if (descriptor_type_2._2_1_ != DESCRIPTOR_QA_TYPE_NONE_BIT >> 0x10) {
          uVar7 = 0xc;
        }
        raw_declarations_2.
        super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             DESCRIPTOR_QA_TYPE_UNIFORM_BUFFER_BIT;
        if (descriptor_type_2._2_1_ != DESCRIPTOR_QA_TYPE_NONE_BIT >> 0x10) {
          raw_declarations_2.
          super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               DESCRIPTOR_QA_TYPE_STORAGE_BUFFER_BIT;
        }
        std::
        vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ::vector((vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                  *)&resource_id_2);
        instrumentation_2.resource_size_id = 0;
        instrumentation_2.elem_size_id = 0;
        sVar12 = std::
                 vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                 ::size((vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                         *)((long)&local_root_signature_entry->field_1 + 4));
        std::
        vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ::reserve((vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                   *)&resource_id_2,sVar12);
        memset((void *)((long)&cb_5 + 4),0,0xc);
        if (local_root_signature_entry->type == Constants) {
LAB_001fc016:
          this = (vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                  *)((long)&local_root_signature_entry->field_1 + 4);
          __end6 = std::
                   vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                   ::begin(this);
          alias_2 = (RawDeclarationVariable *)
                    std::
                    vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                    ::end(this);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end6,(__normal_iterator<dxil_spv::Converter::Impl::RawDeclarationVariable_*,_std::vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>_>
                                             *)&alias_2), bVar3) {
            pRVar13 = __gnu_cxx::
                      __normal_iterator<dxil_spv::Converter::Impl::RawDeclarationVariable_*,_std::vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>_>
                      ::operator*(&__end6);
            instrumentation_2.elem_size_id = pRVar13->var_id;
            bVar3 = build_load_resource_handle
                              ((Impl *)instruction_local,instrumentation_2.elem_size_id,
                               (ResourceReference *)local_root_signature_entry,
                               raw_declarations_2.
                               super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                               _resource_range_local,pVStack_48,(bool)(builder._7_1_ & 1),
                               (bool *)((long)&descriptor_type_2 + 3),(Id *)0x0,
                               &instrumentation_2.resource_size_id,(Id *)0x0,
                               (ResourceMetaInstrumentation *)((long)&cb_5 + 4));
            if (!bVar3) {
              p_Var14 = get_thread_log_callback();
              if (p_Var14 == (LoggingCallback)0x0) {
                fprintf(_stderr,"[ERROR]: Failed to load CBV resource handle.\n");
                fflush(_stderr);
              }
              else {
                snprintf(local_7478,0x1000,"Failed to load CBV resource handle.\n");
                pvVar15 = get_thread_log_callback_userdata();
                (*p_Var14)(pvVar15,Error,local_7478);
              }
              impl_local._7_1_ = 0;
              bVar3 = true;
              goto LAB_001fc2e2;
            }
            incoming_meta_2 = *(mapped_type **)&pRVar13->declaration;
            local_7480 = (pRVar13->declaration).vecsize;
            local_747c = instrumentation_2.resource_size_id;
            std::
            vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
            ::push_back((vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                         *)&resource_id_2,(value_type *)&incoming_meta_2);
            __gnu_cxx::
            __normal_iterator<dxil_spv::Converter::Impl::RawDeclarationVariable_*,_std::vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>_>
            ::operator++(&__end6);
          }
          meta_7 = std::
                   unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                   ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                                 *)&instruction_local[0xf].super_Instruction.attachments._M_h.
                                    _M_rehash_policy._M_next_resize,&instrumentation_2.elem_size_id)
          ;
          reference_3 = (ResourceReference *)
                        std::
                        unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                        ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                                      *)&instruction_local[0xf].super_Instruction.attachments._M_h.
                                         _M_rehash_policy._M_next_resize,
                                     &instrumentation_2.resource_size_id);
          Converter::Impl::ResourceMeta::operator=((ResourceMeta *)reference_3,meta_7);
          *(undefined1 *)((long)&reference_3->base_offset + 1) = descriptor_type_2._3_1_ & 1;
          reference_3->stride = uVar7;
          std::
          vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
          ::operator=((vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                       *)&(reference_3->var_alias_group).
                          super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                      (vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                       *)&resource_id_2);
          *(undefined1 *)&reference_3->var_id = 0xd;
          *(undefined8 *)&reference_3[1].field_0x4 = stack0xffffffffffffabc4;
          *(Id *)((long)&reference_3[1].var_alias_group.
                         super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                         ._M_impl.super__Vector_impl_data._M_start + 4) = instrumentation_2.bda_id;
          if ((descriptor_type_2._3_1_ & 1) != DESCRIPTOR_QA_TYPE_NONE_BIT >> 0x18) {
            if ((descriptor_type_2._2_1_ & 1) == DESCRIPTOR_QA_TYPE_NONE_BIT >> 0x10) {
              spv::Builder::addCapability
                        ((Builder *)reference,CapabilityUniformBufferArrayNonUniformIndexing);
            }
            else {
              spv::Builder::addCapability
                        ((Builder *)reference,CapabilityStorageBufferArrayNonUniformIndexing);
            }
            spv::Builder::addExtension((Builder *)reference,"SPV_EXT_descriptor_indexing");
          }
          bVar3 = false;
        }
        else {
          instrumentation_2.elem_size_id = local_root_signature_entry->type;
          bVar3 = build_load_resource_handle
                            ((Impl *)instruction_local,instrumentation_2.elem_size_id,
                             (ResourceReference *)local_root_signature_entry,
                             raw_declarations_2.
                             super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                             _resource_range_local,pVStack_48,(bool)(builder._7_1_ & 1),
                             (bool *)((long)&descriptor_type_2 + 3),(Id *)0x0,
                             &instrumentation_2.resource_size_id,(Id *)0x0,
                             (ResourceMetaInstrumentation *)((long)&cb_5 + 4));
          if (bVar3) goto LAB_001fc016;
          buffer_5._4088_8_ = get_thread_log_callback();
          if ((LoggingCallback)buffer_5._4088_8_ == (LoggingCallback)0x0) {
            fprintf(_stderr,"[ERROR]: Failed to load CBV resource handle.\n");
            fflush(_stderr);
          }
          else {
            snprintf((char *)&__range6,0x1000,"Failed to load CBV resource handle.\n");
            uVar2 = buffer_5._4088_8_;
            pvVar15 = get_thread_log_callback_userdata();
            (*(code *)uVar2)(pvVar15,2,&__range6);
          }
          impl_local._7_1_ = 0;
          bVar3 = true;
        }
LAB_001fc2e2:
        std::
        vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ::~vector((vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                   *)&resource_id_2);
        if (bVar3) goto LAB_001fc4d6;
      }
      else {
        meta_6._4_4_ = build_shader_record_access_chain
                                 ((Impl *)instruction_local,
                                  *(uint *)&local_root_signature_entry[1].table_entries.
                                            super__Vector_base<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
        local_53a8 = std::
                     unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                     ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                                   *)&instruction_local[0xf].super_Instruction.attachments._M_h.
                                      _M_rehash_policy._M_next_resize,
                                  (key_type *)((long)&meta_6 + 4));
        local_53f8.kind = Invalid;
        local_53f8.component_type = Invalid;
        local_53f8.raw_component_vecsize = V1;
        local_53f8.stride = 0;
        local_53f8.var_id = 0;
        memset(&local_53f8.var_alias_group,0,0x18);
        std::
        vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ::vector(&local_53f8.var_alias_group);
        local_53f8.aliased = false;
        local_53f8.non_uniform = false;
        local_53f8.counter_is_physical_pointer = false;
        local_53f8.rov = false;
        local_53f8.storage = StorageClassUniformConstant;
        local_53f8.counter_var_id = 0;
        local_53f8.physical_pointer_meta.nonwritable = false;
        local_53f8.physical_pointer_meta.nonreadable = false;
        local_53f8.physical_pointer_meta.coherent = false;
        local_53f8.physical_pointer_meta.rov = false;
        local_53f8.physical_pointer_meta.stride = '\0';
        local_53f8.physical_pointer_meta.size = 0;
        local_53f8.index_offset_id = 0;
        local_53f8.instrumentation.bda_id = 0;
        local_53f8.instrumentation.elem_size_id = 0;
        local_53f8.instrumentation.resource_size_id = 0;
        Converter::Impl::ResourceMeta::operator=(local_53a8,&local_53f8);
        Converter::Impl::ResourceMeta::~ResourceMeta(&local_53f8);
        local_53a8->storage = StorageClassShaderRecordBufferKHR;
        local_53a8->kind = CBuffer;
        mVar1 = *(mapped_type *)
                 &local_root_signature_entry[1].table_entries.
                  super__Vector_base<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        _storage_2 = _resource_range_local;
        pmVar11 = std::
                  unordered_map<const_LLVMBC::Value_*,_unsigned_int,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>_>
                  ::operator[]((unordered_map<const_LLVMBC::Value_*,_unsigned_int,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>_>
                                *)&instruction_local[0x10].super_Instruction.attachments._M_h.
                                   _M_rehash_policy,(key_type *)&storage_2);
        *pmVar11 = mVar1;
        Converter::Impl::rewrite_value
                  ((Impl *)instruction_local,(Value *)_resource_range_local,meta_6._4_4_);
      }
    }
    else {
      Converter::Impl::rewrite_value
                ((Impl *)instruction_local,(Value *)_resource_range_local,
                 local_root_signature_entry->type);
      mVar1 = *(mapped_type *)
               ((long)&(local_root_signature_entry->table_entries).
                       super__Vector_base<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
      pCStack_5398 = _resource_range_local;
      local_538c = mVar1;
      pmVar11 = std::
                unordered_map<const_LLVMBC::Value_*,_unsigned_int,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>_>
                ::operator[]((unordered_map<const_LLVMBC::Value_*,_unsigned_int,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>_>
                              *)&instruction_local[0x10].super_Instruction.attachments._M_h.
                                 _M_rehash_policy,(key_type *)&stack0xffffffffffffac68);
      *pmVar11 = mVar1;
    }
    break;
  case Sampler:
    pRStack_74a0 = get_resource_reference
                             ((Impl *)instruction_local,instruction_offset_local._7_1_,
                              _resource_range_local,(ValueKind)instruction_offset_local);
    loaded_id_3 = pRStack_74a0->var_id;
    local_74a5 = false;
    cb_7._4_4_ = 0;
    bVar3 = build_load_resource_handle
                      ((Impl *)instruction_local,loaded_id_3,pRStack_74a0,
                       DESCRIPTOR_QA_TYPE_SAMPLER_BIT,_resource_range_local,pVStack_48,
                       (bool)(builder._7_1_ & 1),&local_74a5,(Id *)0x0,(Id *)((long)&cb_7 + 4),
                       (Id *)0x0,(ResourceMetaInstrumentation *)0x0);
    if (!bVar3) {
      buffer_7._4088_8_ = get_thread_log_callback();
      if ((LoggingCallback)buffer_7._4088_8_ == (LoggingCallback)0x0) {
        fprintf(_stderr,"[ERROR]: Failed to load Sampler resource handle.\n");
        fflush(_stderr);
      }
      else {
        snprintf((char *)&meta_8,0x1000,"Failed to load Sampler resource handle.\n");
        uVar2 = buffer_7._4088_8_;
        pvVar15 = get_thread_log_callback_userdata();
        (*(code *)uVar2)(pvVar15,2,&meta_8);
      }
      impl_local._7_1_ = 0;
      goto LAB_001fc4d6;
    }
    this_00 = std::
              unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
              ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                            *)&instruction_local[0xf].super_Instruction.attachments._M_h.
                               _M_rehash_policy._M_next_resize,(key_type *)((long)&cb_7 + 4));
    pmVar16 = std::
              unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
              ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                            *)&instruction_local[0xf].super_Instruction.attachments._M_h.
                               _M_rehash_policy._M_next_resize,&loaded_id_3);
    Converter::Impl::ResourceMeta::operator=(this_00,pmVar16);
    this_00->non_uniform = (bool)(local_74a5 & 1);
    if ((local_74a5 & 1U) != 0) {
      spv::Builder::addCapability
                ((Builder *)reference,CapabilitySampledImageArrayNonUniformIndexing);
      spv::Builder::addExtension((Builder *)reference,"SPV_EXT_descriptor_indexing");
    }
    break;
  default:
    impl_local._7_1_ = 0;
    goto LAB_001fc4d6;
  }
  impl_local._7_1_ = 1;
LAB_001fc4d6:
  return (bool)(impl_local._7_1_ & 1);
}

Assistant:

static bool emit_create_handle(Converter::Impl &impl, const llvm::CallInst *instruction,
                               DXIL::ResourceType resource_type, unsigned resource_range,
                               llvm::Value *instruction_offset, bool non_uniform)
{
	auto &builder = impl.builder();
	switch (resource_type)
	{
	case DXIL::ResourceType::SRV:
	{
		auto &reference = get_resource_reference(impl, resource_type, instruction, resource_range);

		if (resource_is_physical_rtas(impl, reference))
		{
			spv::Id ptr_id = build_load_physical_rtas(impl, reference, instruction_offset, non_uniform);
			impl.rewrite_value(instruction, ptr_id);
			auto &meta = impl.handle_to_resource_meta[ptr_id];
			meta = {};
			meta.storage = spv::StorageClassGeneric;
			meta.kind = DXIL::ResourceKind::RTAccelerationStructure;
		}
		else if (resource_is_physical_pointer(impl, reference))
		{
			spv::Id ptr_id = build_root_descriptor_load_physical_pointer(impl, reference);
			impl.rewrite_value(instruction, ptr_id);
			auto &meta = impl.handle_to_resource_meta[ptr_id];
			meta = {};
			meta.stride = reference.stride;
			meta.storage = spv::StorageClassPhysicalStorageBuffer;
			meta.physical_pointer_meta.nonwritable = true;
			meta.kind = reference.resource_kind;
		}
		else
		{
			bool is_non_uniform = false;

			spv::Id representative_var_id = reference.var_id;
			if (!representative_var_id && !reference.var_alias_group.empty())
				representative_var_id = reference.var_alias_group.front().var_id;
			auto storage = get_resource_storage_class(impl, representative_var_id);

			DescriptorQATypeFlagBits descriptor_type;
			if (storage == spv::StorageClassStorageBuffer)
				descriptor_type = DESCRIPTOR_QA_TYPE_STORAGE_BUFFER_BIT;
			else if (resource_kind_is_buffer(reference.resource_kind))
				descriptor_type = DESCRIPTOR_QA_TYPE_UNIFORM_TEXEL_BUFFER_BIT;
			else if (reference.resource_kind == DXIL::ResourceKind::RTAccelerationStructure)
				descriptor_type = DESCRIPTOR_QA_TYPE_RT_ACCELERATION_STRUCTURE_BIT;
			else
				descriptor_type = DESCRIPTOR_QA_TYPE_SAMPLED_IMAGE_BIT;

			Vector<Converter::Impl::RawDeclarationVariable> raw_declarations;
			spv::Id loaded_id = 0;
			spv::Id offset_id = 0;
			spv::Id resource_id = 0;
			raw_declarations.reserve(reference.var_alias_group.size());

			Converter::Impl::ResourceMetaInstrumentation instrumentation = {};

			if (reference.var_id)
			{
				resource_id = reference.var_id;
				if (!build_load_resource_handle(impl, resource_id, reference, descriptor_type, instruction,
												instruction_offset, non_uniform, is_non_uniform,
												nullptr, &loaded_id, &offset_id, &instrumentation))
				{
					LOGE("Failed to load SRV resource handle.\n");
					return false;
				}
			}

			for (auto &alias : reference.var_alias_group)
			{
				resource_id = alias.var_id;
				if (!build_load_resource_handle(impl, resource_id, reference, descriptor_type,
												instruction, instruction_offset, non_uniform, is_non_uniform,
												nullptr, &loaded_id, &offset_id, &instrumentation))
				{
					LOGE("Failed to load SRV resource handle.\n");
					return false;
				}

				raw_declarations.push_back({ alias.declaration, loaded_id });
			}

			auto &incoming_meta = impl.handle_to_resource_meta[resource_id];

			spv::Id offset_buffer_id = get_offset_buffer_variable(impl, resource_type, instruction, resource_range);
			if (offset_buffer_id)
			{
				offset_id = build_load_buffer_offset(impl, reference, incoming_meta,
				                                     offset_buffer_id, offset_id, non_uniform);
			}
			else
				offset_id = 0;

			auto &meta = impl.handle_to_resource_meta[loaded_id];
			meta = incoming_meta;
			meta.non_uniform = is_non_uniform;
			meta.index_offset_id = offset_id;
			meta.var_alias_group = std::move(raw_declarations);
			meta.aliased = reference.aliased;
			meta.physical_pointer_meta.nonwritable = true;
			meta.instrumentation = instrumentation;

			// The base array variable does not know what the stride is, promote that state here.
			if (reference.bindless)
				meta.stride = reference.stride;

			if (is_non_uniform)
			{
				spv::Id type_id = builder.getDerefTypeId(resource_id);
				type_id = builder.getContainedTypeId(type_id);

				if (builder.getTypeClass(type_id) != spv::OpTypeAccelerationStructureKHR)
				{
					if (meta.storage == spv::StorageClassStorageBuffer)
						builder.addCapability(spv::CapabilityStorageBufferArrayNonUniformIndexing);
					else if (builder.getTypeDimensionality(type_id) == spv::DimBuffer)
						builder.addCapability(spv::CapabilityUniformTexelBufferArrayNonUniformIndexing);
					else
						builder.addCapability(spv::CapabilitySampledImageArrayNonUniformIndexingEXT);
				}
				builder.addExtension("SPV_EXT_descriptor_indexing");
			}
		}
		break;
	}

	case DXIL::ResourceType::UAV:
	{
		if (resource_range == impl.ags.uav_magic_resource_type_index)
		{
			// Resources tied to constant uints are considered "magic".
			if (impl.ags.magic_ptr_id == 0)
			{
				spv::Id dummy_value = impl.spirv_module.allocate_id();
				impl.ags.magic_ptr_id = dummy_value;
			}

			impl.rewrite_value(instruction, impl.ags.magic_ptr_id);
			break;
		}

		auto &reference = get_resource_reference(impl, resource_type, instruction, resource_range);

		if (resource_is_physical_pointer(impl, reference))
		{
			spv::Id ptr_id = build_root_descriptor_load_physical_pointer(impl, reference);
			impl.rewrite_value(instruction, ptr_id);
			auto &meta = impl.handle_to_resource_meta[ptr_id];
			meta = {};
			meta.stride = reference.stride;
			meta.storage = spv::StorageClassPhysicalStorageBuffer;
			meta.physical_pointer_meta.coherent = reference.coherent;
			meta.physical_pointer_meta.rov = reference.rov;
			meta.kind = reference.resource_kind;
			meta.rov = reference.rov;
		}
		else
		{
			bool is_non_uniform = false;

			spv::Id representative_var_id = reference.var_id;
			if (!representative_var_id && !reference.var_alias_group.empty())
				representative_var_id = reference.var_alias_group.front().var_id;
			auto storage = get_resource_storage_class(impl, representative_var_id);

			DescriptorQATypeFlagBits descriptor_type;
			if (storage == spv::StorageClassStorageBuffer)
				descriptor_type = DESCRIPTOR_QA_TYPE_STORAGE_BUFFER_BIT;
			else if (resource_kind_is_buffer(reference.resource_kind))
				descriptor_type = DESCRIPTOR_QA_TYPE_STORAGE_TEXEL_BUFFER_BIT;
			else
				descriptor_type = DESCRIPTOR_QA_TYPE_STORAGE_IMAGE_BIT;

			Vector<Converter::Impl::RawDeclarationVariable> raw_declarations;
			spv::Id loaded_id = 0;
			spv::Id offset_id = 0;
			spv::Id resource_id = 0;
			spv::Id resource_ptr_id = 0;
			raw_declarations.reserve(reference.var_alias_group.size());

			Converter::Impl::ResourceMetaInstrumentation instrumentation = {};

			if (reference.var_id)
			{
				resource_id = reference.var_id;
				if (!build_load_resource_handle(impl, resource_id, reference, descriptor_type, instruction,
				                                instruction_offset, non_uniform, is_non_uniform, &resource_ptr_id,
				                                &loaded_id, &offset_id, &instrumentation))
				{
					LOGE("Failed to load UAV resource handle.\n");
					return false;
				}
			}

			for (auto &alias : reference.var_alias_group)
			{
				resource_id = alias.var_id;
				if (!build_load_resource_handle(impl, resource_id, reference, descriptor_type,
												instruction, instruction_offset, non_uniform, is_non_uniform,
												nullptr, &loaded_id, &offset_id, &instrumentation))
				{
					LOGE("Failed to load UAV resource handle.\n");
					return false;
				}

				raw_declarations.push_back({ alias.declaration, loaded_id });
			}

			auto &incoming_meta = impl.handle_to_resource_meta[resource_id];

			spv::Id offset_buffer_id = get_offset_buffer_variable(impl, resource_type, instruction, resource_range);
			if (offset_buffer_id)
			{
				offset_id = build_load_buffer_offset(impl, reference, incoming_meta,
				                                     offset_buffer_id, offset_id, non_uniform);
			}
			else
				offset_id = 0;

			auto &meta = impl.handle_to_resource_meta[loaded_id];
			meta = incoming_meta;
			meta.non_uniform = is_non_uniform;
			meta.index_offset_id = offset_id;
			meta.var_alias_group = std::move(raw_declarations);
			meta.aliased = reference.aliased;
			meta.rov = reference.rov;
			meta.physical_pointer_meta.coherent = reference.coherent;
			meta.instrumentation = instrumentation;

			// Image atomics requires the pointer to image and not OpTypeImage directly.
			meta.var_id = resource_ptr_id;

			// The base array variable does not know what the stride is, promote that state here.
			if (reference.bindless)
				meta.stride = reference.stride;

			if (is_non_uniform)
			{
				spv::Id type_id = builder.getDerefTypeId(resource_id);
				type_id = builder.getContainedTypeId(type_id);

				if (meta.storage == spv::StorageClassStorageBuffer)
					builder.addCapability(spv::CapabilityStorageBufferArrayNonUniformIndexing);
				else if (builder.getTypeDimensionality(type_id) == spv::DimBuffer)
					builder.addCapability(spv::CapabilityStorageTexelBufferArrayNonUniformIndexing);
				else
					builder.addCapability(spv::CapabilityStorageImageArrayNonUniformIndexing);
				builder.addExtension("SPV_EXT_descriptor_indexing");
			}

			if (impl.llvm_values_using_update_counter.count(instruction) != 0)
			{
				auto &counter_reference = get_resource_counter_reference(impl, instruction, resource_range);

				if (counter_reference.bindless)
				{
					if (counter_reference.resource_kind == DXIL::ResourceKind::RawBuffer)
					{
						meta.counter_var_id = build_load_physical_pointer(impl, counter_reference, instruction_offset, instruction);
						meta.counter_is_physical_pointer = true;
						// Don't support this since the physical pointer we get from heap is actually the counter.
						meta.instrumentation = {};
					}
					else
					{
						if (!build_load_resource_handle(impl, counter_reference.var_id, reference,
						                                DESCRIPTOR_QA_TYPE_RAW_VA_BIT,
						                                instruction, instruction_offset, non_uniform,
						                                is_non_uniform, &meta.counter_var_id, nullptr, nullptr, nullptr))
						{
							LOGE("Failed to load UAV counter pointer.\n");
							return false;
						}
						meta.counter_is_physical_pointer = false;
					}
				}
				else
				{
					meta.counter_var_id = counter_reference.var_id;
					meta.counter_is_physical_pointer = false;
				}
			}
		}
		break;
	}

	case DXIL::ResourceType::CBV:
	{
		auto &reference = get_resource_reference(impl, resource_type, instruction, resource_range);
		const LocalRootSignatureEntry *local_root_signature_entry = nullptr;
		if (reference.local_root_signature_entry >= 0)
			local_root_signature_entry = &impl.local_root_signature[reference.local_root_signature_entry];

		// Special case root constants since these resources point directly to
		// the push constant block or SBT and not to any concrete resource,
		// so we cannot deduce storage classes properly.

		if (resource_is_physical_pointer(impl, reference))
		{
			spv::Id ptr_id = build_root_descriptor_load_physical_pointer(impl, reference);
			auto &meta = impl.handle_to_resource_meta[ptr_id];
			meta = {};
			meta.stride = reference.stride;
			meta.storage = spv::StorageClassPhysicalStorageBuffer;
			meta.physical_pointer_meta.nonwritable = true;
			meta.kind = reference.resource_kind;
			impl.rewrite_value(instruction, ptr_id);
		}
		else if (reference.var_id != 0 && reference.var_id == impl.root_constant_id)
		{
			// Point directly to root constants.
			impl.rewrite_value(instruction, reference.var_id);
			unsigned member_offset = reference.push_constant_member;
			impl.handle_to_root_member_offset[instruction] = member_offset;
		}
		else if (local_root_signature_entry && local_root_signature_entry->type == LocalRootSignatureType::Constants)
		{
			// Access chain into the desired member once.
			spv::Id id = build_shader_record_access_chain(impl, reference.local_root_signature_entry);

			auto &meta = impl.handle_to_resource_meta[id];
			meta = {};
			meta.storage = spv::StorageClassShaderRecordBufferKHR;
			meta.kind = DXIL::ResourceKind::CBuffer;
			impl.handle_to_root_member_offset[instruction] = reference.local_root_signature_entry;
			impl.rewrite_value(instruction, id);
		}
		else
		{
			bool is_non_uniform = false;

			bool ssbo = reference.bindless && impl.options.bindless_cbv_ssbo_emulation;
			auto storage = ssbo ? spv::StorageClassStorageBuffer : spv::StorageClassUniform;
			auto descriptor_type = ssbo ? DESCRIPTOR_QA_TYPE_STORAGE_BUFFER_BIT : DESCRIPTOR_QA_TYPE_UNIFORM_BUFFER_BIT;

			Vector<Converter::Impl::RawDeclarationVariable> raw_declarations;
			spv::Id loaded_id = 0;
			spv::Id resource_id = 0;
			raw_declarations.reserve(reference.var_alias_group.size());

			Converter::Impl::ResourceMetaInstrumentation instrumentation = {};

			if (reference.var_id)
			{
				resource_id = reference.var_id;
				if (!build_load_resource_handle(impl, resource_id, reference, descriptor_type, instruction,
												instruction_offset, non_uniform, is_non_uniform,
												nullptr, &loaded_id, nullptr, &instrumentation))
				{
					LOGE("Failed to load CBV resource handle.\n");
					return false;
				}
			}

			for (auto &alias : reference.var_alias_group)
			{
				resource_id = alias.var_id;
				if (!build_load_resource_handle(impl, resource_id, reference, descriptor_type,
												instruction, instruction_offset, non_uniform, is_non_uniform,
												nullptr, &loaded_id, nullptr, &instrumentation))
				{
					LOGE("Failed to load CBV resource handle.\n");
					return false;
				}

				raw_declarations.push_back({ alias.declaration, loaded_id });
			}

			auto &incoming_meta = impl.handle_to_resource_meta[resource_id];

			auto &meta = impl.handle_to_resource_meta[loaded_id];
			meta = incoming_meta;
			meta.non_uniform = is_non_uniform;
			meta.storage = storage;
			meta.var_alias_group = std::move(raw_declarations);
			meta.kind = DXIL::ResourceKind::CBuffer;
			meta.instrumentation = instrumentation;

			if (is_non_uniform)
			{
				if (ssbo)
					builder.addCapability(spv::CapabilityStorageBufferArrayNonUniformIndexingEXT);
				else
					builder.addCapability(spv::CapabilityUniformBufferArrayNonUniformIndexingEXT);
				builder.addExtension("SPV_EXT_descriptor_indexing");
			}
		}
		break;
	}

	case DXIL::ResourceType::Sampler:
	{
		auto &reference = get_resource_reference(impl, resource_type, instruction, resource_range);
		spv::Id base_sampler_id = reference.var_id;

		bool is_non_uniform = false;
		spv::Id loaded_id = 0;
		if (!build_load_resource_handle(impl, base_sampler_id, reference, DESCRIPTOR_QA_TYPE_SAMPLER_BIT, instruction,
		                                instruction_offset, non_uniform, is_non_uniform, nullptr, &loaded_id, nullptr, nullptr))
		{
			LOGE("Failed to load Sampler resource handle.\n");
			return false;
		}

		auto &meta = impl.handle_to_resource_meta[loaded_id];
		meta = impl.handle_to_resource_meta[base_sampler_id];
		meta.non_uniform = is_non_uniform;

		if (is_non_uniform)
		{
			builder.addCapability(spv::CapabilitySampledImageArrayNonUniformIndexingEXT);
			builder.addExtension("SPV_EXT_descriptor_indexing");
		}
		break;
	}

	default:
		return false;
	}

	return true;
}